

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3GetToken(uchar *z,int *tokenType)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uchar uVar7;
  int iVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uStack_10;
  
  bVar1 = *z;
  uVar4 = (ulong)bVar1;
  lVar5 = 1;
  switch("\x1c\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\a\x1b\a\a\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\x0f\b\x05\x04\x16\x18\b\x11\x12\x15\x14\x17\v\x1a\x10\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x05\x13\f\x0e\r\x06\x05\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
         [uVar4]) {
  case '\0':
    if (z[1] == '\'') {
      *tokenType = 0x92;
      uVar4 = 1;
      do {
        lVar5 = uVar4 + 1;
        uVar4 = uVar4 + 1;
      } while ((""[z[lVar5]] & 8) != 0);
      if ((uVar4 & 1) != 0 || z[lVar5] != 0x27) {
        *tokenType = 0xaf;
        for (; (z[uVar4] != '\0' && (z[uVar4] != '\'')); uVar4 = uVar4 + 1) {
        }
      }
      uStack_10 = (ulong)(((int)uVar4 + 1) - (uint)(z[(int)uVar4] == '\0'));
      goto LAB_0014d2ba;
    }
  case '\x02':
switchD_0014cdae_caseD_2:
    uStack_10 = (ulong)((int)lVar5 - 1);
    pbVar9 = z + lVar5;
    do {
      bVar1 = *pbVar9;
      uStack_10 = (ulong)((int)uStack_10 + 1);
      pbVar9 = pbVar9 + 1;
    } while ((""[bVar1] & 0x46) != 0);
LAB_0014d00e:
    *tokenType = 0x3b;
    goto LAB_0014d2ba;
  case '\x01':
    uStack_10 = 0;
    lVar5 = 0x100000000;
    do {
      lVar6 = uStack_10 + 1;
      lVar5 = lVar5 + 0x100000000;
      uStack_10 = uStack_10 + 1;
    } while ("\x1c\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\a\x1b\a\a\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\x0f\b\x05\x04\x16\x18\b\x11\x12\x15\x14\x17\v\x1a\x10\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x05\x13\f\x0e\r\x06\x05\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
             [z[lVar6]] < 2);
    if ((""[z[lVar6]] & 0x46) == 0) {
      *tokenType = 0x3b;
      keywordCode((char *)z,(int)uStack_10,tokenType);
      goto LAB_0014d2ba;
    }
    lVar5 = lVar5 >> 0x20;
    goto switchD_0014cdae_caseD_2;
  case '\x03':
    goto switchD_0014cdae_caseD_3;
  case '\x04':
  case '\x05':
    *tokenType = 0x94;
    iVar3 = 0;
    uStack_10 = 1;
    while( true ) {
      iVar8 = (int)uStack_10;
      bVar1 = z[iVar8];
      if ((ulong)bVar1 == 0) break;
      if ((""[bVar1] & 0x46) == 0) {
        if (0 < iVar3 && bVar1 == 0x28) {
          pbVar9 = z + iVar8;
          uStack_10 = (ulong)(iVar8 + 1);
          goto LAB_0014d215;
        }
        if ((bVar1 != 0x3a) || (z[(long)iVar8 + 1] != ':')) break;
        iVar8 = iVar8 + 1;
      }
      else {
        iVar3 = iVar3 + 1;
      }
      uStack_10 = (ulong)(iVar8 + 1);
    }
    goto LAB_0014d247;
  case '\x06':
    *tokenType = 0x94;
    uStack_10 = 0;
    do {
      lVar5 = uStack_10 + 1;
      uStack_10 = uStack_10 + 1;
    } while (0xfffffffffffffff5 < (ulong)z[lVar5] - 0x3a);
    goto LAB_0014d2ba;
  case '\a':
    uStack_10 = 0;
    do {
      lVar5 = uStack_10 + 1;
      uStack_10 = uStack_10 + 1;
    } while ((""[z[lVar5]] & 1) != 0);
    goto LAB_0014cf70;
  case '\b':
    uStack_10 = 1;
    while( true ) {
      iVar3 = (int)uStack_10;
      lVar5 = (long)iVar3;
      if (z[lVar5] == 0) break;
      if (z[lVar5] == bVar1) {
        uStack_10 = lVar5 + 1;
        iVar3 = (int)uStack_10;
        if (z[lVar5 + 1] != bVar1) {
          if (bVar1 != 0x27) goto LAB_0014d00e;
          *tokenType = 0x6e;
          goto LAB_0014d2ba;
        }
      }
      uStack_10 = (ulong)(iVar3 + 1);
    }
    goto LAB_0014d24b;
  case '\t':
    uStack_10 = 1;
    iVar3 = 0x3b;
    while ((char)uVar4 != ']') {
      uVar4 = (ulong)z[uStack_10];
      if (z[uStack_10] == 0) {
        iVar3 = 0xaf;
        break;
      }
      uStack_10 = uStack_10 + 1;
    }
    *tokenType = iVar3;
    goto LAB_0014d2ba;
  case '\n':
    if (z[1] != '|') {
      *tokenType = 0x61;
      break;
    }
    *tokenType = 0x69;
    goto LAB_0014d2ad;
  case '\v':
    if (z[1] != '-') {
      *tokenType = 0x65;
      break;
    }
    for (uStack_10 = 2; (z[uStack_10] != '\0' && (z[uStack_10] != '\n')); uStack_10 = uStack_10 + 1)
    {
    }
    goto LAB_0014cf70;
  case '\f':
    uVar7 = z[1];
    if (uVar7 == '<') {
      *tokenType = 0x62;
    }
    else {
      if (uVar7 == '>') goto LAB_0014d1c2;
      if (uVar7 != '=') {
        *tokenType = 0x38;
        break;
      }
      *tokenType = 0x37;
    }
    goto LAB_0014d2ad;
  case '\r':
    if (z[1] == '>') {
      *tokenType = 99;
    }
    else {
      if (z[1] != '=') {
        *tokenType = 0x36;
        break;
      }
      *tokenType = 0x39;
    }
    goto LAB_0014d2ad;
  case '\x0e':
    *tokenType = 0x35;
    uStack_10 = (ulong)((z[1] == '=') + 1);
    goto LAB_0014d2ba;
  case '\x0f':
    if (z[1] != '=') goto switchD_0014cdae_caseD_1b;
LAB_0014d1c2:
    *tokenType = 0x34;
LAB_0014d2ad:
    uStack_10 = 2;
    goto LAB_0014d2ba;
  case '\x10':
    if ((z[1] != '*') || (z[2] == '\0')) {
      *tokenType = 0x67;
      break;
    }
    uStack_10 = 4;
    uVar7 = z[2];
    for (uVar4 = 3; uVar2 = z[uVar4], uVar2 != '/' || uVar7 != '*'; uVar4 = uVar4 + 1) {
      if (uVar2 == '\0') {
        uStack_10 = uVar4 & 0xffffffff;
        break;
      }
      uStack_10 = (ulong)((int)uStack_10 + 1);
      uVar7 = uVar2;
    }
LAB_0014cf70:
    *tokenType = 0xae;
    goto LAB_0014d2ba;
  case '\x11':
    *tokenType = 0x16;
    break;
  case '\x12':
    *tokenType = 0x17;
    break;
  case '\x13':
    *tokenType = 1;
    break;
  case '\x14':
    *tokenType = 100;
    break;
  case '\x15':
    *tokenType = 0x66;
    break;
  case '\x16':
    *tokenType = 0x68;
    break;
  case '\x17':
    *tokenType = 0x1a;
    break;
  case '\x18':
    *tokenType = 0x60;
    break;
  case '\x19':
    *tokenType = 0x6b;
    break;
  case '\x1a':
    if ((ulong)z[1] - 0x3a < 0xfffffffffffffff6) {
      *tokenType = 0x86;
      break;
    }
    goto switchD_0014cdae_caseD_3;
  default:
switchD_0014cdae_caseD_1b:
    *tokenType = 0xaf;
    break;
  case '\x1c':
    *tokenType = 0xaf;
    uStack_10 = 0;
    goto LAB_0014d2ba;
  }
  uStack_10 = 1;
LAB_0014d2ba:
  return (int)uStack_10;
  while ((uStack_10 = (ulong)((int)uVar4 + 1), uVar10 != 0x29 && ((""[uVar10] & 1) == 0))) {
LAB_0014d215:
    uVar4 = uStack_10;
    pbVar9 = pbVar9 + 1;
    uVar10 = (ulong)*pbVar9;
    if (uVar10 == 0) goto LAB_0014d23f;
  }
  if (*pbVar9 != 0x29) {
LAB_0014d23f:
    *tokenType = 0xaf;
    uStack_10 = uVar4;
  }
LAB_0014d247:
  if (iVar3 != 0) goto LAB_0014d2ba;
LAB_0014d24b:
  *tokenType = 0xaf;
  goto LAB_0014d2ba;
switchD_0014cdae_caseD_3:
  *tokenType = 0x93;
  if (((*z == '0') && ((z[1] | 0x20) == 0x78)) && ((""[z[2]] & 8) != 0)) {
    lVar5 = 3;
    do {
      pbVar9 = z + lVar5;
      lVar5 = lVar5 + 1;
    } while ((""[*pbVar9] & 8) != 0);
    uStack_10 = (ulong)((int)lVar5 - 1);
  }
  else {
    lVar5 = -1;
    do {
      lVar6 = lVar5 + 1;
      lVar5 = lVar5 + 1;
    } while (0xfffffffffffffff5 < (ulong)z[lVar6] - 0x3a);
    if (z[lVar6] == 0x2e) {
      do {
        lVar6 = lVar5 + 1;
        lVar5 = lVar5 + 1;
      } while (0xfffffffffffffff5 < (ulong)z[lVar6] - 0x3a);
      *tokenType = 0x91;
    }
    uStack_10 = (ulong)(int)lVar5;
    if (((z[uStack_10] | 0x20) == 0x65) &&
       ((bVar1 = z[uStack_10 + 1], 0xfffffffffffffff5 < (ulong)bVar1 - 0x3a ||
        (((bVar1 == 0x2d || (bVar1 == 0x2b)) &&
         (0xfffffffffffffff5 < (ulong)z[uStack_10 + 2] - 0x3a)))))) {
      lVar6 = (lVar5 << 0x20) + 0x100000000;
      pbVar9 = z + ((lVar5 << 0x20) + 0x200000000 >> 0x20);
      do {
        bVar1 = *pbVar9;
        lVar6 = lVar6 + 0x100000000;
        pbVar9 = pbVar9 + 1;
      } while (0xfffffffffffffff5 < (ulong)bVar1 - 0x3a);
      *tokenType = 0x91;
      uStack_10 = lVar6 >> 0x20;
    }
    while ((""[z[uStack_10]] & 0x46) != 0) {
      *tokenType = 0xaf;
      uStack_10 = uStack_10 + 1;
    }
  }
  goto LAB_0014d2ba;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetToken(const unsigned char *z, int *tokenType){
  int i, c;
  switch( aiClass[*z] ){  /* Switch on the character-class of the first byte
                          ** of the token. See the comment on the CC_ defines
                          ** above. */
    case CC_SPACE: {
      testcase( z[0]==' ' );
      testcase( z[0]=='\t' );
      testcase( z[0]=='\n' );
      testcase( z[0]=='\f' );
      testcase( z[0]=='\r' );
      for(i=1; sqlite3Isspace(z[i]); i++){}
      *tokenType = TK_SPACE;
      return i;
    }
    case CC_MINUS: {
      if( z[1]=='-' ){
        for(i=2; (c=z[i])!=0 && c!='\n'; i++){}
        *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
        return i;
      }
      *tokenType = TK_MINUS;
      return 1;
    }
    case CC_LP: {
      *tokenType = TK_LP;
      return 1;
    }
    case CC_RP: {
      *tokenType = TK_RP;
      return 1;
    }
    case CC_SEMI: {
      *tokenType = TK_SEMI;
      return 1;
    }
    case CC_PLUS: {
      *tokenType = TK_PLUS;
      return 1;
    }
    case CC_STAR: {
      *tokenType = TK_STAR;
      return 1;
    }
    case CC_SLASH: {
      if( z[1]!='*' || z[2]==0 ){
        *tokenType = TK_SLASH;
        return 1;
      }
      for(i=3, c=z[2]; (c!='*' || z[i]!='/') && (c=z[i])!=0; i++){}
      if( c ) i++;
      *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
      return i;
    }
    case CC_PERCENT: {
      *tokenType = TK_REM;
      return 1;
    }
    case CC_EQ: {
      *tokenType = TK_EQ;
      return 1 + (z[1]=='=');
    }
    case CC_LT: {
      if( (c=z[1])=='=' ){
        *tokenType = TK_LE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_NE;
        return 2;
      }else if( c=='<' ){
        *tokenType = TK_LSHIFT;
        return 2;
      }else{
        *tokenType = TK_LT;
        return 1;
      }
    }
    case CC_GT: {
      if( (c=z[1])=='=' ){
        *tokenType = TK_GE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_RSHIFT;
        return 2;
      }else{
        *tokenType = TK_GT;
        return 1;
      }
    }
    case CC_BANG: {
      if( z[1]!='=' ){
        *tokenType = TK_ILLEGAL;
        return 1;
      }else{
        *tokenType = TK_NE;
        return 2;
      }
    }
    case CC_PIPE: {
      if( z[1]!='|' ){
        *tokenType = TK_BITOR;
        return 1;
      }else{
        *tokenType = TK_CONCAT;
        return 2;
      }
    }
    case CC_COMMA: {
      *tokenType = TK_COMMA;
      return 1;
    }
    case CC_AND: {
      *tokenType = TK_BITAND;
      return 1;
    }
    case CC_TILDA: {
      *tokenType = TK_BITNOT;
      return 1;
    }
    case CC_QUOTE: {
      int delim = z[0];
      testcase( delim=='`' );
      testcase( delim=='\'' );
      testcase( delim=='"' );
      for(i=1; (c=z[i])!=0; i++){
        if( c==delim ){
          if( z[i+1]==delim ){
            i++;
          }else{
            break;
          }
        }
      }
      if( c=='\'' ){
        *tokenType = TK_STRING;
        return i+1;
      }else if( c!=0 ){
        *tokenType = TK_ID;
        return i+1;
      }else{
        *tokenType = TK_ILLEGAL;
        return i;
      }
    }
    case CC_DOT: {
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( !sqlite3Isdigit(z[1]) )
#endif
      {
        *tokenType = TK_DOT;
        return 1;
      }
      /* If the next character is a digit, this is a floating point
      ** number that begins with ".".  Fall thru into the next case */
    }
    case CC_DIGIT: {
      testcase( z[0]=='0' );  testcase( z[0]=='1' );  testcase( z[0]=='2' );
      testcase( z[0]=='3' );  testcase( z[0]=='4' );  testcase( z[0]=='5' );
      testcase( z[0]=='6' );  testcase( z[0]=='7' );  testcase( z[0]=='8' );
      testcase( z[0]=='9' );
      *tokenType = TK_INTEGER;
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( z[0]=='0' && (z[1]=='x' || z[1]=='X') && sqlite3Isxdigit(z[2]) ){
        for(i=3; sqlite3Isxdigit(z[i]); i++){}
        return i;
      }
#endif
      for(i=0; sqlite3Isdigit(z[i]); i++){}
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( z[i]=='.' ){
        i++;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
      if( (z[i]=='e' || z[i]=='E') &&
           ( sqlite3Isdigit(z[i+1]) 
            || ((z[i+1]=='+' || z[i+1]=='-') && sqlite3Isdigit(z[i+2]))
           )
      ){
        i += 2;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
#endif
      while( IdChar(z[i]) ){
        *tokenType = TK_ILLEGAL;
        i++;
      }
      return i;
    }
    case CC_QUOTE2: {
      for(i=1, c=z[0]; c!=']' && (c=z[i])!=0; i++){}
      *tokenType = c==']' ? TK_ID : TK_ILLEGAL;
      return i;
    }
    case CC_VARNUM: {
      *tokenType = TK_VARIABLE;
      for(i=1; sqlite3Isdigit(z[i]); i++){}
      return i;
    }
    case CC_DOLLAR:
    case CC_VARALPHA: {
      int n = 0;
      testcase( z[0]=='$' );  testcase( z[0]=='@' );
      testcase( z[0]==':' );  testcase( z[0]=='#' );
      *tokenType = TK_VARIABLE;
      for(i=1; (c=z[i])!=0; i++){
        if( IdChar(c) ){
          n++;
#ifndef SQLITE_OMIT_TCL_VARIABLE
        }else if( c=='(' && n>0 ){
          do{
            i++;
          }while( (c=z[i])!=0 && !sqlite3Isspace(c) && c!=')' );
          if( c==')' ){
            i++;
          }else{
            *tokenType = TK_ILLEGAL;
          }
          break;
        }else if( c==':' && z[i+1]==':' ){
          i++;
#endif
        }else{
          break;
        }
      }
      if( n==0 ) *tokenType = TK_ILLEGAL;
      return i;
    }
    case CC_KYWD: {
      for(i=1; aiClass[z[i]]<=CC_KYWD; i++){}
      if( IdChar(z[i]) ){
        /* This token started out using characters that can appear in keywords,
        ** but z[i] is a character not allowed within keywords, so this must
        ** be an identifier instead */
        i++;
        break;
      }
      *tokenType = TK_ID;
      return keywordCode((char*)z, i, tokenType);
    }
    case CC_X: {
#ifndef SQLITE_OMIT_BLOB_LITERAL
      testcase( z[0]=='x' ); testcase( z[0]=='X' );
      if( z[1]=='\'' ){
        *tokenType = TK_BLOB;
        for(i=2; sqlite3Isxdigit(z[i]); i++){}
        if( z[i]!='\'' || i%2 ){
          *tokenType = TK_ILLEGAL;
          while( z[i] && z[i]!='\'' ){ i++; }
        }
        if( z[i] ) i++;
        return i;
      }
#endif
      /* If it is not a BLOB literal, then it must be an ID, since no
      ** SQL keywords start with the letter 'x'.  Fall through */
    }
    case CC_ID: {
      i = 1;
      break;
    }
    case CC_NUL: {
      *tokenType = TK_ILLEGAL;
      return 0;
    }
    default: {
      *tokenType = TK_ILLEGAL;
      return 1;
    }
  }
  while( IdChar(z[i]) ){ i++; }
  *tokenType = TK_ID;
  return i;
}